

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_memory.c
# Opt level: O0

int SUNMemoryHelper_CopyAsync
              (SUNMemoryHelper helper,SUNMemory dst,SUNMemory src,size_t memory_size,void *queue)

{
  int iVar1;
  SUNMemory in_RCX;
  SUNMemory in_RDX;
  SUNMemoryHelper in_RSI;
  long in_RDI;
  size_t in_R8;
  int ier;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  if (*(long *)(*(long *)(in_RDI + 8) + 0x18) == 0) {
    iVar1 = SUNMemoryHelper_Copy
                      (in_RSI,in_RDX,in_RCX,in_R8,
                       (void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  else {
    iVar1 = (**(code **)(*(long *)(in_RDI + 8) + 0x18))(in_RDI,in_RSI,in_RDX,in_RCX,in_R8);
  }
  return iVar1;
}

Assistant:

int SUNMemoryHelper_CopyAsync(SUNMemoryHelper helper, SUNMemory dst,
                              SUNMemory src, size_t memory_size,
                              void* queue)
{
  int ier;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(helper));
  if (helper->ops->copyasync == NULL)
    ier = SUNMemoryHelper_Copy(helper, dst, src, memory_size, queue);
  else
    ier = helper->ops->copyasync(helper, dst, src, memory_size, queue);
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(helper));
  return(ier);
}